

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InlineCache.cpp
# Opt level: O0

void __thiscall
Js::ScriptContextPolymorphicInlineCache::Finalize
          (ScriptContextPolymorphicInlineCache *this,bool isShutdown)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  JavascriptLibrary *pJVar4;
  ScriptContext **ppSVar5;
  InlineCacheAllocator *pIVar6;
  ScriptContext *pSVar7;
  ThreadContext *this_00;
  int local_20;
  int local_1c;
  int i_1;
  int i;
  uint unregisteredInlineCacheCount;
  bool isShutdown_local;
  ScriptContextPolymorphicInlineCache *this_local;
  
  if ((this->super_PolymorphicInlineCache).size == 0) {
    if ((this->super_PolymorphicInlineCache).inlineCaches != (Type)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InlineCache.cpp"
                                  ,0x41e,"(!inlineCaches)","!inlineCaches");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
  }
  else {
    pJVar4 = Memory::WriteBarrierPtr<Js::JavascriptLibrary>::operator->(&this->javascriptLibrary);
    ppSVar5 = Memory::WriteBarrierPtr::operator_cast_to_ScriptContext__
                        ((WriteBarrierPtr *)&(pJVar4->super_JavascriptLibraryBase).scriptContext);
    if (*ppSVar5 != (ScriptContext *)0x0) {
      i_1 = 0;
      if (((this->super_PolymorphicInlineCache).inlineCaches == (Type)0x0) ||
         ((this->super_PolymorphicInlineCache).size == 0)) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InlineCache.cpp"
                                    ,0x42a,"(inlineCaches && size > 0)","inlineCaches && size > 0");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 0;
      }
      if (isShutdown) {
        for (local_1c = 0; local_1c < (int)(uint)(this->super_PolymorphicInlineCache).size;
            local_1c = local_1c + 1) {
          InlineCache::Clear((this->super_PolymorphicInlineCache).inlineCaches + local_1c);
        }
      }
      else {
        for (local_20 = 0; local_20 < (int)(uint)(this->super_PolymorphicInlineCache).size;
            local_20 = local_20 + 1) {
          bVar2 = InlineCache::RemoveFromInvalidationList
                            ((this->super_PolymorphicInlineCache).inlineCaches + local_20);
          if (bVar2) {
            i_1 = i_1 + 1;
          }
        }
        pJVar4 = Memory::WriteBarrierPtr<Js::JavascriptLibrary>::operator->
                           (&this->javascriptLibrary);
        pSVar7 = Memory::WriteBarrierPtr<Js::ScriptContext>::operator->
                           (&(pJVar4->super_JavascriptLibraryBase).scriptContext);
        pIVar6 = ScriptContext::GetInlineCacheAllocator(pSVar7);
        Memory::DeleteArray<Memory::InlineCacheAllocator,Js::InlineCache>
                  (pIVar6,(ulong)(this->super_PolymorphicInlineCache).size,
                   (this->super_PolymorphicInlineCache).inlineCaches);
        pJVar4 = Memory::WriteBarrierPtr<Js::JavascriptLibrary>::operator->
                           (&this->javascriptLibrary);
        pSVar7 = Memory::WriteBarrierPtr<Js::ScriptContext>::operator->
                           (&(pJVar4->super_JavascriptLibraryBase).scriptContext);
        pIVar6 = ScriptContext::GetInlineCacheAllocator(pSVar7);
        Memory::InlineCacheAllocator::LogPolyCacheFree
                  (pIVar6,(ulong)(this->super_PolymorphicInlineCache).size << 5);
      }
      (this->super_PolymorphicInlineCache).inlineCaches = (Type)0x0;
      (this->super_PolymorphicInlineCache).size = 0;
      if (i_1 != 0) {
        pJVar4 = Memory::WriteBarrierPtr<Js::JavascriptLibrary>::operator->
                           (&this->javascriptLibrary);
        pSVar7 = Memory::WriteBarrierPtr<Js::ScriptContext>::operator->
                           (&(pJVar4->super_JavascriptLibraryBase).scriptContext);
        this_00 = ScriptContext::GetThreadContext(pSVar7);
        ThreadContext::NotifyInlineCacheBatchUnregistered(this_00,i_1);
      }
    }
  }
  return;
}

Assistant:

void ScriptContextPolymorphicInlineCache::Finalize(bool isShutdown)
    {
        if (size == 0)
        {
            // Already finalized
            Assert(!inlineCaches);
            return;
        }
        if (this->javascriptLibrary->scriptContext == nullptr)
        {
            // If caches were made during ScriptContext initialization, and initialization failed the ScriptContext
            // and InlineCacheAllocator will be freed, so we don't need to do anything during finalization
            return;
        }

        uint unregisteredInlineCacheCount = 0;

        Assert(inlineCaches && size > 0);

        // If we're not shutting down (as in closing the script context), we need to remove our inline caches from
        // thread context's invalidation lists, and release memory back to the arena.  During script context shutdown,
        // we leave everything in place, because the inline cache arena will stay alive until script context is destroyed
        // (as in destructor has been called) and thus the invalidation lists are safe to keep references to caches from this
        // script context.  We will, however, zero all inline caches so that we don't have to process them on subsequent
        // collections, which may still happen from other script contexts.
        if (isShutdown)
        {
#if DBG
            for (int i = 0; i < size; i++)
            {
                inlineCaches[i].Clear();
            }
#else
            memset(inlineCaches, 0, size * sizeof(InlineCache));
#endif
        }
        else
        {
            for (int i = 0; i < size; i++)
            {
                if (inlineCaches[i].RemoveFromInvalidationList())
                {
                    unregisteredInlineCacheCount++;
                }
            }
            AllocatorDeleteArray(InlineCacheAllocator, this->javascriptLibrary->scriptContext->GetInlineCacheAllocator(), size, inlineCaches);
#ifdef POLY_INLINE_CACHE_SIZE_STATS
            this->javascriptLibrary->scriptContext->GetInlineCacheAllocator()->LogPolyCacheFree(size * sizeof(InlineCache));
#endif
        }

        inlineCaches = nullptr;
        size = 0;
        if (unregisteredInlineCacheCount > 0)
        {
            this->javascriptLibrary->scriptContext->GetThreadContext()->NotifyInlineCacheBatchUnregistered(unregisteredInlineCacheCount);
        }
    }